

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

void nni_list_prepend(nni_list *list,void *item)

{
  nni_list_node *pnVar1;
  nni_list_node *pnVar2;
  
  pnVar1 = (nni_list_node *)((long)item + list->ll_offset);
  if ((*(long *)((long)item + list->ll_offset) != 0) || (pnVar1->ln_prev != (nni_list_node *)0x0)) {
    nni_panic("prepending node already on a list or not inited");
  }
  pnVar2 = (list->ll_head).ln_next;
  pnVar1->ln_next = pnVar2;
  pnVar1->ln_prev = &list->ll_head;
  pnVar2->ln_prev = pnVar1;
  pnVar1->ln_prev->ln_next = pnVar1;
  return;
}

Assistant:

void
nni_list_prepend(nni_list *list, void *item)
{
	nni_list_node *node = NODE(list, item);

	if ((node->ln_next != NULL) || (node->ln_prev != NULL)) {
		nni_panic("prepending node already on a list or not inited");
	}
	node->ln_next          = list->ll_head.ln_next;
	node->ln_prev          = &list->ll_head;
	node->ln_next->ln_prev = node;
	node->ln_prev->ln_next = node;
}